

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void AES_setup(AES_state *rounds,uint8_t *key,int nkeywords,int nrounds)

{
  int b_2;
  uint uVar1;
  uint uVar2;
  long lVar3;
  AES_state *pAVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  uint16_t top;
  uint uVar14;
  AES_state rcon;
  AES_state column;
  uint local_74;
  uint local_70;
  uint local_6c;
  ushort local_68;
  undefined6 uStack_66;
  undefined8 uStack_60;
  ulong local_58;
  AES_state *local_50;
  int local_44;
  AES_state local_40;
  
  _local_68 = 1;
  uStack_60 = 0;
  pAVar4 = rounds;
  for (lVar3 = 0; lVar3 <= nrounds; lVar3 = lVar3 + 1) {
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      pAVar4->slice[lVar9] = 0;
    }
    pAVar4 = pAVar4 + 1;
  }
  uVar6 = 0;
  local_50 = rounds;
  uVar14 = 0;
  if (0 < nkeywords) {
    uVar6 = 0;
    uVar14 = nkeywords;
  }
  for (; uVar6 != uVar14; uVar6 = uVar6 + 1) {
    pAVar4 = local_50 + (uVar6 >> 2);
    for (lVar3 = 0; (int)lVar3 != 4; lVar3 = lVar3 + 1) {
      LoadByte(pAVar4,key[lVar3],(int)lVar3,uVar6 & 3);
    }
    key = key + lVar3;
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    local_40.slice[lVar3] =
         local_50[nkeywords - 1U >> 2].slice[lVar3] >> ((byte)(nkeywords - 1U) & 3) & 0x1111;
  }
  local_44 = nrounds * 4 + 4;
  local_6c = (uint)CONCAT62((uint6)(ushort)((uint)local_44 >> 0x10),1);
  local_58 = 0;
  local_74 = 0;
  local_70 = 0;
  uVar14 = 0;
  uVar13 = 0;
  uVar5 = 0;
  iVar7 = 0;
  uVar6 = 0;
  for (iVar8 = nkeywords; iVar8 < local_44; iVar8 = iVar8 + 1) {
    uVar12 = (uint)uVar13;
    uVar10 = (uint)uVar5;
    if (iVar7 == 0) {
      SubBytes(&local_40,0);
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        local_40.slice[lVar3] =
             (local_40.slice[lVar3] << 0xc | local_40.slice[lVar3] >> 4) ^ (&local_68)[lVar3];
      }
      uVar1 = local_70 ^ uVar6;
      uStack_60 = CONCAT62(CONCAT42(CONCAT22((short)uVar5,(short)uVar13),(short)uVar14),(short)uVar1
                          );
      local_70 = local_74 ^ uVar6;
      uVar2 = local_6c ^ uVar6;
      _local_68 = CONCAT62(CONCAT42(CONCAT22((short)local_70,(short)local_58),(short)uVar2),
                           (short)uVar6);
      local_74 = (uint)local_58;
      uVar5 = uVar13;
      uVar12 = uVar14;
      uVar14 = uVar1;
      local_6c = uVar6;
    }
    else {
      uVar2 = (uint)local_58;
      uVar10 = uVar6;
      if (iVar7 == 4 && 6 < nkeywords) {
        local_58 = uVar5;
        SubBytes(&local_40,0);
        uVar5 = local_58 & 0xffffffff;
      }
    }
    iVar7 = iVar7 + 1;
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      uVar11 = local_50[iVar8 - nkeywords >> 2].slice[lVar3] >> ((byte)(iVar8 - nkeywords) & 3) &
               0x1111 ^ local_40.slice[lVar3];
      local_40.slice[lVar3] = uVar11;
      local_50[iVar8 >> 2].slice[lVar3] =
           local_50[iVar8 >> 2].slice[lVar3] | (ushort)((uVar11 & 0x1111) << ((byte)iVar8 & 3));
    }
    if (iVar7 == nkeywords) {
      iVar7 = 0;
    }
    local_58 = (ulong)uVar2;
    uVar13 = (ulong)uVar12;
    uVar6 = uVar10;
  }
  return;
}

Assistant:

static void AES_setup(AES_state* rounds, const uint8_t* key, int nkeywords, int nrounds)
{
    int i;

    /* The one-byte round constant */
    AES_state rcon = {{1,0,0,0,0,0,0,0}};
    /* The number of the word being generated, modulo nkeywords */
    int pos = 0;
    /* The column representing the word currently being processed */
    AES_state column;

    for (i = 0; i < nrounds + 1; i++) {
        int b;
        for (b = 0; b < 8; b++) {
            rounds[i].slice[b] = 0;
        }
    }

    /* The first nkeywords round columns are just taken from the key directly. */
    for (i = 0; i < nkeywords; i++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(&rounds[i >> 2], *(key++), r, i & 3);
        }
    }

    GetOneColumn(&column, &rounds[(nkeywords - 1) >> 2], (nkeywords - 1) & 3);

    for (i = nkeywords; i < 4 * (nrounds + 1); i++) {
        /* Transform column */
        if (pos == 0) {
            SubBytes(&column, 0);
            KeySetupTransform(&column, &rcon);
            MultX(&rcon);
        } else if (nkeywords > 6 && pos == 4) {
            SubBytes(&column, 0);
        }
        if (++pos == nkeywords) pos = 0;
        KeySetupColumnMix(&column, &rounds[i >> 2], &rounds[(i - nkeywords) >> 2], i & 3, (i - nkeywords) & 3);
    }
}